

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompExprAdd(xmlXPathParserContextPtr ctxt,int ch1,int ch2,xmlXPathOp op,int value,
                       int value2,int value3,void *value4,void *value5)

{
  xmlXPathCompExprPtr pxVar1;
  int iVar2;
  xmlXPathStepOp *pxVar3;
  xmlChar *pxVar4;
  
  pxVar1 = ctxt->comp;
  iVar2 = pxVar1->maxStep;
  if (pxVar1->nbStep < iVar2) {
LAB_001e1f30:
    iVar2 = pxVar1->nbStep;
    pxVar1->last = iVar2;
    pxVar3 = pxVar1->steps;
    pxVar3[iVar2].ch1 = ch1;
    pxVar3[iVar2].ch2 = ch2;
    pxVar3[iVar2].op = op;
    pxVar3[iVar2].value = value;
    pxVar3[iVar2].value2 = value2;
    pxVar3[iVar2].value3 = value3;
    if (((pxVar1->dict == (xmlDictPtr)0x0) || (XPATH_OP_FUNCTION < op)) ||
       ((0x3400U >> (op & (XPATH_OP_FILTER|XPATH_OP_PREDICATE)) & 1) == 0)) {
      pxVar3[iVar2].value4 = value4;
      pxVar3[iVar2].value5 = value5;
    }
    else {
      if (value4 == (void *)0x0) {
        pxVar3[iVar2].value4 = (void *)0x0;
      }
      else {
        pxVar4 = xmlDictLookup(pxVar1->dict,(xmlChar *)value4,-1);
        pxVar1->steps[pxVar1->nbStep].value4 = pxVar4;
        (*xmlFree)(value4);
      }
      if (value5 == (void *)0x0) {
        pxVar1->steps[pxVar1->nbStep].value5 = (void *)0x0;
      }
      else {
        pxVar4 = xmlDictLookup(pxVar1->dict,(xmlChar *)value5,-1);
        pxVar1->steps[pxVar1->nbStep].value5 = pxVar4;
        (*xmlFree)(value5);
      }
    }
    iVar2 = pxVar1->nbStep;
    pxVar1->steps[iVar2].cache = (xmlXPathFunction)0x0;
    pxVar1->nbStep = iVar2 + 1;
  }
  else {
    if (iVar2 < 1000000) {
      pxVar1->maxStep = iVar2 * 2;
      pxVar3 = (xmlXPathStepOp *)(*xmlRealloc)(pxVar1->steps,(long)iVar2 * 0x70);
      if (pxVar3 != (xmlXPathStepOp *)0x0) {
        pxVar1->steps = pxVar3;
        goto LAB_001e1f30;
      }
      pxVar1->maxStep = pxVar1->maxStep / 2;
    }
    ctxt->error = 0xf;
    xmlXPathErrMemory(ctxt->context,"adding step\n");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
xmlXPathCompExprAdd(xmlXPathParserContextPtr ctxt, int ch1, int ch2,
   xmlXPathOp op, int value,
   int value2, int value3, void *value4, void *value5) {
    xmlXPathCompExprPtr comp = ctxt->comp;
    if (comp->nbStep >= comp->maxStep) {
	xmlXPathStepOp *real;

        if (comp->maxStep >= XPATH_MAX_STEPS) {
	    xmlXPathPErrMemory(ctxt, "adding step\n");
	    return(-1);
        }
	comp->maxStep *= 2;
	real = (xmlXPathStepOp *) xmlRealloc(comp->steps,
		                      comp->maxStep * sizeof(xmlXPathStepOp));
	if (real == NULL) {
	    comp->maxStep /= 2;
	    xmlXPathPErrMemory(ctxt, "adding step\n");
	    return(-1);
	}
	comp->steps = real;
    }
    comp->last = comp->nbStep;
    comp->steps[comp->nbStep].ch1 = ch1;
    comp->steps[comp->nbStep].ch2 = ch2;
    comp->steps[comp->nbStep].op = op;
    comp->steps[comp->nbStep].value = value;
    comp->steps[comp->nbStep].value2 = value2;
    comp->steps[comp->nbStep].value3 = value3;
    if ((comp->dict != NULL) &&
        ((op == XPATH_OP_FUNCTION) || (op == XPATH_OP_VARIABLE) ||
	 (op == XPATH_OP_COLLECT))) {
        if (value4 != NULL) {
	    comp->steps[comp->nbStep].value4 = (xmlChar *)
	        (void *)xmlDictLookup(comp->dict, value4, -1);
	    xmlFree(value4);
	} else
	    comp->steps[comp->nbStep].value4 = NULL;
        if (value5 != NULL) {
	    comp->steps[comp->nbStep].value5 = (xmlChar *)
	        (void *)xmlDictLookup(comp->dict, value5, -1);
	    xmlFree(value5);
	} else
	    comp->steps[comp->nbStep].value5 = NULL;
    } else {
	comp->steps[comp->nbStep].value4 = value4;
	comp->steps[comp->nbStep].value5 = value5;
    }
    comp->steps[comp->nbStep].cache = NULL;
    return(comp->nbStep++);
}